

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datarate_test.cc
# Opt level: O0

void __thiscall
datarate_test::anon_unknown_0::DatarateTestLarge::BasicRateTargetingMultiThreadCBRTest
          (DatarateTestLarge *this)

{
  bool bVar1;
  __tuple_element_t<4UL,_tuple<const_CodecFactory_*,_TestMode,_int,_unsigned_int,_int>_> *p_Var2;
  AssertHelper *this_00;
  Message *pMVar3;
  Message *pMVar4;
  char *message;
  long in_RDI;
  AssertHelper *this_01;
  Message *message_00;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  int bitrate_array [2];
  I420VideoSource video;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffe5c;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffe64;
  double *in_stack_fffffffffffffe68;
  char *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  int iVar7;
  char *in_stack_fffffffffffffe80;
  string *in_stack_fffffffffffffe88;
  Type TVar8;
  HasNewFatalFailureHelper *in_stack_fffffffffffffe90;
  uint in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea8;
  Message *in_stack_fffffffffffffed8;
  AssertHelper *in_stack_fffffffffffffee0;
  AssertionResult local_118 [2];
  double local_f8;
  double local_f0;
  AssertionResult local_e8 [2];
  uint local_c4;
  HasNewFatalFailureHelper local_c0;
  undefined8 local_a8 [3];
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [104];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"niklas_640_480_30.yuv",&local_89);
  uVar6 = 400;
  uVar5 = 0;
  libaom_test::I420VideoSource::I420VideoSource
            ((I420VideoSource *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
             (uint)((ulong)in_stack_fffffffffffffe80 >> 0x20),(uint)in_stack_fffffffffffffe80,
             (int)((ulong)in_stack_fffffffffffffe78 >> 0x20),(int)in_stack_fffffffffffffe78,
             in_stack_fffffffffffffea0,in_stack_fffffffffffffea8);
  TVar8 = (Type)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  *(undefined4 *)(in_RDI + 0xd0) = 500;
  *(undefined4 *)(in_RDI + 0xd4) = 500;
  *(undefined4 *)(in_RDI + 0xcc) = 1000;
  *(undefined4 *)(in_RDI + 0x6c) = 1;
  *(undefined4 *)(in_RDI + 0xbc) = 0;
  *(undefined4 *)(in_RDI + 0xc0) = 0x3f;
  *(undefined4 *)(in_RDI + 0x90) = 1;
  *(undefined4 *)(in_RDI + 0x68) = 0;
  *(undefined4 *)(in_RDI + 0x34) = 4;
  local_a8[0] = 0x28a000000fa;
  testing::
  WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
  ::GetParam();
  p_Var2 = std::get<4ul,libaom_test::CodecFactory_const*,libaom_test::TestMode,int,unsigned_int,int>
                     ((tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>
                       *)0x7842ae);
  *(undefined4 *)(in_RDI + 0xb8) = *(undefined4 *)((long)local_a8 + (long)*p_Var2 * 4);
  (**(code **)(*(long *)(in_RDI + 0x18) + 0x98))(in_RDI + 0x18);
  *(undefined4 *)(in_RDI + 0x458) = 2;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper(in_stack_fffffffffffffe90)
    ;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      (**(code **)(*(long *)(in_RDI + 0x18) + 0x10))(in_RDI + 0x18,local_68);
    }
    bVar1 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure(&local_c0);
    if (bVar1) {
      local_c4 = 2;
    }
    else {
      local_c4 = 0;
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)CONCAT44(in_stack_fffffffffffffe64,uVar6));
    if (local_c4 == 0) {
      local_f0 = (double)*(uint *)(in_RDI + 0xb8);
      local_f8 = *(double *)(in_RDI + 0x420) * 0.85;
      testing::internal::CmpHelperGE<double,double>
                (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                 (double *)CONCAT44(in_stack_fffffffffffffe64,uVar6));
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_e8);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe90);
        testing::Message::operator<<
                  ((Message *)CONCAT44(in_stack_fffffffffffffe64,uVar6),
                   (char (*) [59])CONCAT44(in_stack_fffffffffffffe5c,uVar5));
        testing::AssertionResult::failure_message((AssertionResult *)0x7845a9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffe90,TVar8,in_stack_fffffffffffffe80,
                   (int)((ulong)in_stack_fffffffffffffe78 >> 0x20),in_stack_fffffffffffffe70);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe64,uVar6));
        testing::Message::~Message((Message *)0x784603);
      }
      local_c4 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x78468a);
      if (local_c4 == 0) {
        this_01 = (AssertHelper *)(double)*(uint *)(in_RDI + 0xb8);
        message_00 = (Message *)(*(double *)(in_RDI + 0x420) * 1.15);
        testing::internal::CmpHelperLE<double,double>
                  (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                   (double *)CONCAT44(in_stack_fffffffffffffe64,uVar6));
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_118);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe90);
          this_00 = (AssertHelper *)
                    testing::Message::operator<<
                              ((Message *)CONCAT44(in_stack_fffffffffffffe64,uVar6),
                               (char (*) [46])CONCAT44(in_stack_fffffffffffffe5c,uVar5));
          pMVar3 = testing::Message::operator<<
                             ((Message *)CONCAT44(in_stack_fffffffffffffe64,uVar6),
                              (uint *)CONCAT44(in_stack_fffffffffffffe5c,uVar5));
          TVar8 = (Type)((ulong)pMVar3 >> 0x20);
          pMVar3 = testing::Message::operator<<
                             ((Message *)CONCAT44(in_stack_fffffffffffffe64,uVar6),
                              (char (*) [2])CONCAT44(in_stack_fffffffffffffe5c,uVar5));
          pMVar4 = testing::Message::operator<<
                             ((Message *)CONCAT44(in_stack_fffffffffffffe64,uVar6),
                              (double *)CONCAT44(in_stack_fffffffffffffe5c,uVar5));
          iVar7 = (int)((ulong)pMVar4 >> 0x20);
          message = testing::AssertionResult::failure_message((AssertionResult *)0x7847ab);
          testing::internal::AssertHelper::AssertHelper(this_00,TVar8,(char *)pMVar3,iVar7,message);
          testing::internal::AssertHelper::operator=(this_01,message_00);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe64,uVar6));
          testing::Message::~Message((Message *)0x7847f9);
        }
        local_c4 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x784877);
        if (local_c4 == 0) {
          local_c4 = 0;
        }
      }
      goto LAB_0078488f;
    }
    if (local_c4 != 2) goto LAB_0078488f;
  }
  iVar7 = (int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  testing::Message::Message((Message *)in_stack_fffffffffffffe90);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffe90,TVar8,in_stack_fffffffffffffe80,iVar7,
             in_stack_fffffffffffffe70);
  testing::internal::AssertHelper::operator=(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe64,uVar6));
  testing::Message::~Message((Message *)0x78449e);
  local_c4 = 1;
LAB_0078488f:
  libaom_test::I420VideoSource::~I420VideoSource((I420VideoSource *)0x78489c);
  return;
}

Assistant:

virtual void BasicRateTargetingMultiThreadCBRTest() {
    ::libaom_test::I420VideoSource video("niklas_640_480_30.yuv", 640, 480, 30,
                                         1, 0, 400);
    cfg_.rc_buf_initial_sz = 500;
    cfg_.rc_buf_optimal_sz = 500;
    cfg_.rc_buf_sz = 1000;
    cfg_.rc_dropframe_thresh = 1;
    cfg_.rc_min_quantizer = 0;
    cfg_.rc_max_quantizer = 63;
    cfg_.rc_end_usage = AOM_CBR;
    cfg_.g_lag_in_frames = 0;
    cfg_.g_threads = 4;

    const int bitrate_array[2] = { 250, 650 };
    cfg_.rc_target_bitrate = bitrate_array[GET_PARAM(4)];
    ResetModel();
    tile_columns_ = 2;
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
    ASSERT_GE(static_cast<double>(cfg_.rc_target_bitrate),
              effective_datarate_ * 0.85)
        << " The datarate for the file exceeds the target by too much!";
    ASSERT_LE(static_cast<double>(cfg_.rc_target_bitrate),
              effective_datarate_ * 1.15)
        << " The datarate for the file missed the target!"
        << cfg_.rc_target_bitrate << " " << effective_datarate_;
  }